

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

Future<void> * __thiscall
tf::Executor::
run_until<multiple_subflow_runs_with_predicate(unsigned_int)::__4,multiple_subflow_runs_with_predicate(unsigned_int)::__5>
          (Executor *this,Taskflow *f,anon_class_4_1_ba1d75eb *p,anon_class_8_1_a7c1402f *c)

{
  bool bVar1;
  size_type sVar2;
  anon_class_4_1_ba1d75eb *in_RCX;
  anon_class_4_1_ba1d75eb *in_RSI;
  Future<void> *in_RDI;
  anon_class_8_1_a7c1402f *unaff_retaddr;
  lock_guard<std::mutex> lock;
  shared_ptr<tf::Topology> t;
  promise<void> promise;
  Future<void> *future;
  promise<void> *in_stack_ffffffffffffff08;
  Executor *in_stack_ffffffffffffff10;
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  *this_00;
  future<void> *in_stack_ffffffffffffff18;
  future<void> *f_00;
  Future<void> *in_stack_ffffffffffffff20;
  Future<void> *this_01;
  Future<void> *__args_2;
  Taskflow *in_stack_ffffffffffffff48;
  promise<void> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  Worker *in_stack_ffffffffffffff78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff80;
  Future<void> local_78 [2];
  anon_class_4_1_ba1d75eb *local_20;
  
  __args_2 = in_RDI;
  local_20 = in_RCX;
  _increment_topology(in_stack_ffffffffffffff10);
  bVar1 = Taskflow::empty((Taskflow *)0x11962b);
  if ((bVar1) ||
     (bVar1 = multiple_subflow_runs_with_predicate::anon_class_4_1_ba1d75eb::operator()(local_20),
     bVar1)) {
    multiple_subflow_runs_with_predicate::anon_class_8_1_a7c1402f::operator()(unaff_retaddr);
    std::promise<void>::promise((promise<void> *)in_RDI);
    std::promise<void>::set_value(in_stack_ffffffffffffff50);
    _decrement_topology(in_stack_ffffffffffffff10);
    std::promise<void>::get_future(in_stack_ffffffffffffff08);
    local_78[0].super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78[0].super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = local_78;
    std::weak_ptr<tf::Topology>::weak_ptr((weak_ptr<tf::Topology> *)0x1196b0);
    Future<void>::Future
              (this_01,in_stack_ffffffffffffff18,(weak_ptr<tf::Topology> *)in_stack_ffffffffffffff10
              );
    std::weak_ptr<tf::Topology>::~weak_ptr((weak_ptr<tf::Topology> *)0x1196d6);
    std::future<void>::~future((future<void> *)0x1196e3);
    std::promise<void>::~promise((promise<void> *)this_01);
  }
  else {
    f_00 = (future<void> *)&stack0xffffffffffffff78;
    std::
    make_shared<tf::Topology,tf::Taskflow&,multiple_subflow_runs_with_predicate(unsigned_int)::__4,multiple_subflow_runs_with_predicate(unsigned_int)::__5>
              (in_stack_ffffffffffffff48,in_RSI,(anon_class_8_1_a7c1402f *)__args_2);
    uVar3 = 0;
    std::__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<tf::Topology,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x119781);
    std::promise<void>::get_future(in_stack_ffffffffffffff08);
    this_00 = (queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
               *)&stack0xffffffffffffff50;
    std::weak_ptr<tf::Topology>::weak_ptr<tf::Topology,void>
              ((weak_ptr<tf::Topology> *)this_00,
               (shared_ptr<tf::Topology> *)in_stack_ffffffffffffff08);
    Future<void>::Future(in_stack_ffffffffffffff20,f_00,(weak_ptr<tf::Topology> *)this_00);
    std::weak_ptr<tf::Topology>::~weak_ptr((weak_ptr<tf::Topology> *)0x1197c8);
    std::future<void>::~future((future<void> *)0x1197d2);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffff08);
    std::
    queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
    ::push(this_00,(value_type *)in_stack_ffffffffffffff08);
    sVar2 = std::
            queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
            ::size((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                    *)0x119813);
    if (sVar2 == 1) {
      std::__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff78)
      ;
      _set_up_topology((Executor *)in_stack_ffffffffffffff80._M_pi,in_stack_ffffffffffffff78,
                       (Topology *)CONCAT17(uVar3,in_stack_ffffffffffffff70));
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1198cc);
    std::shared_ptr<tf::Topology>::~shared_ptr((shared_ptr<tf::Topology> *)0x1198ec);
  }
  return __args_2;
}

Assistant:

tf::Future<void> Executor::run_until(Taskflow& f, P&& p, C&& c) {

  _increment_topology();

  //// Need to check the empty under the lock since subflow task may
  //// define detached blocks that modify the taskflow at the same time
  //bool empty;
  //{
  //  std::lock_guard<std::mutex> lock(f._mutex);
  //  empty = f.empty();
  //}

  // No need to create a real topology but returns an dummy future
  if(f.empty() || p()) {
    c();
    std::promise<void> promise;
    promise.set_value();
    _decrement_topology();
    return tf::Future<void>(promise.get_future());
  }

  // create a topology for this run
  auto t = std::make_shared<Topology>(f, std::forward<P>(p), std::forward<C>(c));

  // need to create future before the topology got torn down quickly
  tf::Future<void> future(t->_promise.get_future(), t);

  // modifying topology needs to be protected under the lock
  {
    std::lock_guard<std::mutex> lock(f._mutex);
    f._topologies.push(t);
    if(f._topologies.size() == 1) {
      _set_up_topology(pt::this_worker, t.get());
    }
  }

  return future;
}